

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseUnaryOp.h
# Opt level: O2

RealScalar __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::squaredNorm
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this)

{
  double *pdVar1;
  PointerType ptr;
  
  pdVar1 = *(double **)this;
  return pdVar1[2] * pdVar1[2] + pdVar1[1] * pdVar1[1] + *pdVar1 * *pdVar1;
}

Assistant:

explicit CwiseUnaryOp(const XprType& xpr, const UnaryOp& func = UnaryOp())
      : m_xpr(xpr), m_functor(func) {}